

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/tests/test_http_server.c"
            );
  UnityDefaultTestRun(test_read_until_errors,"test_read_until_errors",0x7cc);
  UnityDefaultTestRun(test_close_error,"test_close_error",0x7cd);
  UnityDefaultTestRun(test_read_at_least_error,"test_read_at_least_error",0x7ce);
  UnityDefaultTestRun(test_write_error,"test_write_error",1999);
  UnityDefaultTestRun(test_server_init,"test_server_init",0x7d1);
  UnityDefaultTestRun(test_server_init_no_config,"test_server_init_no_config",0x7d2);
  UnityDefaultTestRun(test_shutdown,"test_shutdown",0x7d3);
  UnityDefaultTestRun(test_register_request_target,"test_register_request_target",0x7d5);
  UnityDefaultTestRun(test_serve_locations,"test_serve_locations",0x7d6);
  UnityDefaultTestRun(test_keepalive_handling,"test_keepalive_handling",0x7d7);
  UnityDefaultTestRun(test_callbacks_after_response_sent,"test_callbacks_after_response_sent",0x7d8)
  ;
  UnityDefaultTestRun(test_url_callbacks,"test_url_callbacks",0x7d9);
  UnityDefaultTestRun(test_errors_in_serve,"test_errors_in_serve",0x7da);
  UnityDefaultTestRun(test_error_without_error_callback,"test_error_without_error_callback",0x7db);
  UnityDefaultTestRun(test_errors_in_accept,"test_errors_in_accept",0x7dc);
  UnityDefaultTestRun(test_parse_errors,"test_parse_errors",0x7dd);
  UnityDefaultTestRun(test_connection_upgrade,"test_connection_upgrade",0x7df);
  UnityDefaultTestRun(test_timer_cancel_errors,"test_timer_cancel_errors",0x7e1);
  UnityDefaultTestRun(test_timer_expires_errors,"test_timer_expires_errors",0x7e2);
  UnityDefaultTestRun(test_response_callback_after_message_complete,
                      "test_response_callback_after_message_complete",0x7e4);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
	UNITY_BEGIN();

	RUN_TEST(test_read_until_errors);
	RUN_TEST(test_close_error);
	RUN_TEST(test_read_at_least_error);
	RUN_TEST(test_write_error);

	RUN_TEST(test_server_init);
	RUN_TEST(test_server_init_no_config);
	RUN_TEST(test_shutdown);

	RUN_TEST(test_register_request_target);
	RUN_TEST(test_serve_locations);
	RUN_TEST(test_keepalive_handling);
	RUN_TEST(test_callbacks_after_response_sent);
	RUN_TEST(test_url_callbacks);
	RUN_TEST(test_errors_in_serve);
	RUN_TEST(test_error_without_error_callback);
	RUN_TEST(test_errors_in_accept);
	RUN_TEST(test_parse_errors);

	RUN_TEST(test_connection_upgrade);

	RUN_TEST(test_timer_cancel_errors);
	RUN_TEST(test_timer_expires_errors);

	RUN_TEST(test_response_callback_after_message_complete);

	return UNITY_END();
}